

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_textedit_key(nk_text_edit *state,nk_keys key,int shift_mod,nk_user_font *font,
                    float row_height)

{
  nk_rune nVar1;
  int iVar2;
  int iVar3;
  nk_text_find *pnVar4;
  float fVar5;
  float local_68;
  nk_text_find find;
  nk_text_edit_row row;
  
LAB_001411b7:
  switch(key) {
  case NK_KEY_DEL:
    if (state->mode == '\0') {
      return;
    }
    if (state->select_start == state->select_end) {
      if (state->cursor < (state->string).len) {
        nk_textedit_delete(state,state->cursor,1);
      }
    }
    else {
LAB_0014151d:
      nk_textedit_delete_selection(state);
    }
LAB_00141669:
    state->has_preferred_x = '\0';
    return;
  default:
    return;
  case NK_KEY_BACKSPACE:
    if (state->mode == '\0') {
      return;
    }
    if (state->select_start != state->select_end) goto LAB_0014151d;
    nk_textedit_clamp(state);
    if (0 < state->cursor) {
      nk_textedit_delete(state,state->cursor + -1,1);
      state->cursor = state->cursor + -1;
    }
    goto LAB_00141669;
  case NK_KEY_UP:
    if (state->single_line == '\0') {
      if (shift_mod == 0) {
        if (state->select_start != state->select_end) {
          nk_textedit_move_to_first(state);
        }
      }
      else {
        nk_textedit_prep_selection_at_cursor(state);
      }
      nk_textedit_clamp(state);
      nk_textedit_find_charpos(&find,state,state->cursor,(uint)state->single_line,font,row_height);
      if (find.prev_first == find.first_char) {
        return;
      }
      pnVar4 = (nk_text_find *)&state->preferred_x;
      if (state->has_preferred_x == '\0') {
        pnVar4 = &find;
      }
      local_68 = pnVar4->x;
      state->cursor = find.prev_first;
      nk_textedit_layout_row(&row,state,find.prev_first,row_height,font);
      iVar2 = 0;
      goto LAB_00141867;
    }
    key = NK_KEY_LEFT;
    goto LAB_001411b7;
  case NK_KEY_DOWN:
    if (state->single_line != '\0') goto code_r0x001411ea;
    if (shift_mod == 0) {
      if (state->select_start != state->select_end) {
        nk_textedit_move_to_last(state);
      }
    }
    else {
      nk_textedit_prep_selection_at_cursor(state);
    }
    nk_textedit_clamp(state);
    nk_textedit_find_charpos(&find,state,state->cursor,(uint)state->single_line,font,row_height);
    if (find.length == 0) {
      return;
    }
    pnVar4 = (nk_text_find *)&state->preferred_x;
    if (state->has_preferred_x == '\0') {
      pnVar4 = &find;
    }
    local_68 = pnVar4->x;
    iVar3 = find.length + find.first_char;
    state->cursor = iVar3;
    nk_textedit_layout_row(&row,state,iVar3,row_height,font);
    iVar2 = 0;
    goto LAB_0014175e;
  case NK_KEY_LEFT:
    if (shift_mod == 0) {
      if (state->select_start != state->select_end) {
        nk_textedit_move_to_first(state);
        goto LAB_00141669;
      }
      if (state->cursor < 1) goto LAB_00141669;
      find.first_char = state->cursor + -1;
    }
    else {
      nk_textedit_clamp(state);
      nk_textedit_prep_selection_at_cursor(state);
      find.first_char = state->select_end;
      if (0 < find.first_char) {
        find.first_char = find.first_char + -1;
        goto LAB_00141483;
      }
    }
    break;
  case NK_KEY_RIGHT:
    if (shift_mod == 0) {
      if (state->select_start == state->select_end) {
        state->cursor = state->cursor + 1;
      }
      else {
        nk_textedit_move_to_last(state);
      }
      nk_textedit_clamp(state);
      goto LAB_00141669;
    }
    nk_textedit_prep_selection_at_cursor(state);
    state->select_end = state->select_end + 1;
    nk_textedit_clamp(state);
    find.first_char = state->select_end;
    break;
  case NK_KEY_TEXT_INSERT_MODE:
    if (state->mode == '\0') {
      state->mode = '\x01';
      return;
    }
    return;
  case NK_KEY_TEXT_REPLACE_MODE:
    if (state->mode == '\0') {
      state->mode = '\x02';
      return;
    }
    return;
  case NK_KEY_TEXT_RESET_MODE:
    if ((byte)(state->mode - 1) < 2) {
      state->mode = '\0';
      return;
    }
    return;
  case NK_KEY_TEXT_LINE_START:
    if (shift_mod != 0) {
      nk_textedit_clamp(state);
      nk_textedit_prep_selection_at_cursor(state);
      iVar2 = (state->string).len;
      iVar3 = state->cursor;
      if (iVar3 == iVar2 && iVar2 != 0) {
        iVar3 = iVar2 + -1;
        state->cursor = iVar3;
      }
      nk_textedit_find_charpos(&find,state,iVar3,(uint)state->single_line,font,row_height);
      goto LAB_00141483;
    }
    iVar2 = (state->string).len;
    if ((iVar2 != 0) && (state->cursor == iVar2)) {
      state->cursor = iVar2 + -1;
    }
    nk_textedit_clamp(state);
    nk_textedit_move_to_first(state);
    nk_textedit_find_charpos(&find,state,state->cursor,(uint)state->single_line,font,row_height);
    break;
  case NK_KEY_TEXT_LINE_END:
    if (shift_mod != 0) {
      nk_textedit_clamp(state);
      nk_textedit_prep_selection_at_cursor(state);
      nk_textedit_find_charpos(&find,state,state->cursor,(uint)state->single_line,font,row_height);
      state->has_preferred_x = '\0';
      iVar2 = find.first_char + find.length;
      state->cursor = iVar2;
      if (0 < find.length) {
        nVar1 = nk_str_rune_at(&state->string,iVar2 + -1);
        iVar2 = state->cursor;
        if (nVar1 == 10) {
          iVar2 = iVar2 + -1;
          state->cursor = iVar2;
        }
      }
      state->select_end = iVar2;
      return;
    }
    nk_textedit_clamp(state);
    nk_textedit_move_to_first(state);
    nk_textedit_find_charpos(&find,state,state->cursor,(uint)state->single_line,font,row_height);
    state->has_preferred_x = '\0';
    state->cursor = find.first_char + find.length;
    if (0 < find.length) {
      nVar1 = nk_str_rune_at(&state->string,find.first_char + find.length + -1);
      if (nVar1 == 10) {
        state->cursor = state->cursor + -1;
        return;
      }
      return;
    }
    return;
  case NK_KEY_TEXT_START:
    if (shift_mod == 0) {
      state->select_end = 0;
      state->cursor = 0;
      state->select_start = 0;
    }
    else {
      nk_textedit_prep_selection_at_cursor(state);
      state->select_end = 0;
      state->cursor = 0;
    }
    goto LAB_00141669;
  case NK_KEY_TEXT_END:
    if (shift_mod == 0) {
      state->cursor = (state->string).len;
      state->select_start = 0;
      state->select_end = 0;
      goto LAB_00141669;
    }
    nk_textedit_prep_selection_at_cursor(state);
    find.first_char = (state->string).len;
LAB_00141483:
    state->select_end = find.first_char;
    break;
  case NK_KEY_TEXT_UNDO:
    nk_textedit_undo(state);
    goto LAB_00141669;
  case NK_KEY_TEXT_REDO:
    nk_textedit_redo(state);
    goto LAB_00141669;
  case NK_KEY_TEXT_SELECT_ALL:
    nk_textedit_select_all(state);
    goto LAB_00141669;
  case NK_KEY_TEXT_WORD_LEFT:
    if (shift_mod == 0) {
      if (state->select_start != state->select_end) {
        nk_textedit_move_to_first(state);
        return;
      }
      iVar2 = nk_textedit_move_to_word_previous(state);
LAB_001415bd:
      state->cursor = iVar2;
      goto LAB_001415c3;
    }
    if (state->select_start == state->select_end) {
      nk_textedit_prep_selection_at_cursor(state);
    }
    iVar2 = nk_textedit_move_to_word_previous(state);
    goto LAB_001413b4;
  case NK_KEY_TEXT_WORD_RIGHT:
    if (shift_mod == 0) {
      if (state->select_start != state->select_end) {
        nk_textedit_move_to_last(state);
        return;
      }
      iVar2 = nk_textedit_move_to_word_next(state);
      goto LAB_001415bd;
    }
    if (state->select_start == state->select_end) {
      nk_textedit_prep_selection_at_cursor(state);
    }
    iVar2 = nk_textedit_move_to_word_next(state);
LAB_001413b4:
    state->cursor = iVar2;
    state->select_end = iVar2;
LAB_001415c3:
    nk_textedit_clamp(state);
    return;
  }
  state->cursor = find.first_char;
  goto LAB_00141669;
code_r0x001411ea:
  key = NK_KEY_RIGHT;
  goto LAB_001411b7;
LAB_0014175e:
  if ((row.num_chars <= iVar2) || (row.x1 <= row.x0)) goto LAB_001418b6;
  fVar5 = nk_textedit_get_width(state,iVar3,iVar2,font);
  row.x0 = row.x0 + fVar5;
  if (local_68 < row.x0) goto LAB_001418b6;
  state->cursor = state->cursor + 1;
  iVar2 = iVar2 + 1;
  goto LAB_0014175e;
LAB_00141867:
  if ((row.num_chars <= iVar2) || (row.x1 <= row.x0)) {
LAB_001418b6:
    nk_textedit_clamp(state);
    state->has_preferred_x = '\x01';
    state->preferred_x = local_68;
    if (shift_mod != 0) {
      state->select_end = state->cursor;
      return;
    }
    return;
  }
  fVar5 = nk_textedit_get_width(state,find.prev_first,iVar2,font);
  row.x0 = row.x0 + fVar5;
  if (local_68 < row.x0) goto LAB_001418b6;
  state->cursor = state->cursor + 1;
  iVar2 = iVar2 + 1;
  goto LAB_00141867;
}

Assistant:

NK_LIB void
nk_textedit_key(struct nk_text_edit *state, enum nk_keys key, int shift_mod,
    const struct nk_user_font *font, float row_height)
{
retry:
    switch (key)
    {
    case NK_KEY_NONE:
    case NK_KEY_CTRL:
    case NK_KEY_ENTER:
    case NK_KEY_SHIFT:
    case NK_KEY_TAB:
    case NK_KEY_COPY:
    case NK_KEY_CUT:
    case NK_KEY_PASTE:
    case NK_KEY_MAX:
    default: break;
    case NK_KEY_TEXT_UNDO:
         nk_textedit_undo(state);
         state->has_preferred_x = 0;
         break;

    case NK_KEY_TEXT_REDO:
        nk_textedit_redo(state);
        state->has_preferred_x = 0;
        break;

    case NK_KEY_TEXT_SELECT_ALL:
        nk_textedit_select_all(state);
        state->has_preferred_x = 0;
        break;

    case NK_KEY_TEXT_INSERT_MODE:
        if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
            state->mode = NK_TEXT_EDIT_MODE_INSERT;
        break;
    case NK_KEY_TEXT_REPLACE_MODE:
        if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
            state->mode = NK_TEXT_EDIT_MODE_REPLACE;
        break;
    case NK_KEY_TEXT_RESET_MODE:
        if (state->mode == NK_TEXT_EDIT_MODE_INSERT ||
            state->mode == NK_TEXT_EDIT_MODE_REPLACE)
            state->mode = NK_TEXT_EDIT_MODE_VIEW;
        break;

    case NK_KEY_LEFT:
        if (shift_mod) {
            nk_textedit_clamp(state);
            nk_textedit_prep_selection_at_cursor(state);
            /* move selection left */
            if (state->select_end > 0)
                --state->select_end;
            state->cursor = state->select_end;
            state->has_preferred_x = 0;
        } else {
            /* if currently there's a selection,
             * move cursor to start of selection */
            if (NK_TEXT_HAS_SELECTION(state))
                nk_textedit_move_to_first(state);
            else if (state->cursor > 0)
               --state->cursor;
            state->has_preferred_x = 0;
        } break;

    case NK_KEY_RIGHT:
        if (shift_mod) {
            nk_textedit_prep_selection_at_cursor(state);
            /* move selection right */
            ++state->select_end;
            nk_textedit_clamp(state);
            state->cursor = state->select_end;
            state->has_preferred_x = 0;
        } else {
            /* if currently there's a selection,
             * move cursor to end of selection */
            if (NK_TEXT_HAS_SELECTION(state))
                nk_textedit_move_to_last(state);
            else ++state->cursor;
            nk_textedit_clamp(state);
            state->has_preferred_x = 0;
        } break;

    case NK_KEY_TEXT_WORD_LEFT:
        if (shift_mod) {
            if( !NK_TEXT_HAS_SELECTION( state ) )
            nk_textedit_prep_selection_at_cursor(state);
            state->cursor = nk_textedit_move_to_word_previous(state);
            state->select_end = state->cursor;
            nk_textedit_clamp(state );
        } else {
            if (NK_TEXT_HAS_SELECTION(state))
                nk_textedit_move_to_first(state);
            else {
                state->cursor = nk_textedit_move_to_word_previous(state);
                nk_textedit_clamp(state );
            }
        } break;

    case NK_KEY_TEXT_WORD_RIGHT:
        if (shift_mod) {
            if( !NK_TEXT_HAS_SELECTION( state ) )
                nk_textedit_prep_selection_at_cursor(state);
            state->cursor = nk_textedit_move_to_word_next(state);
            state->select_end = state->cursor;
            nk_textedit_clamp(state);
        } else {
            if (NK_TEXT_HAS_SELECTION(state))
                nk_textedit_move_to_last(state);
            else {
                state->cursor = nk_textedit_move_to_word_next(state);
                nk_textedit_clamp(state );
            }
        } break;

    case NK_KEY_DOWN: {
        struct nk_text_find find;
        struct nk_text_edit_row row;
        int i, sel = shift_mod;

        if (state->single_line) {
            /* on windows, up&down in single-line behave like left&right */
            key = NK_KEY_RIGHT;
            goto retry;
        }

        if (sel)
            nk_textedit_prep_selection_at_cursor(state);
        else if (NK_TEXT_HAS_SELECTION(state))
            nk_textedit_move_to_last(state);

        /* compute current position of cursor point */
        nk_textedit_clamp(state);
        nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
            font, row_height);

        /* now find character position down a row */
        if (find.length)
        {
            float x;
            float goal_x = state->has_preferred_x ? state->preferred_x : find.x;
            int start = find.first_char + find.length;

            state->cursor = start;
            nk_textedit_layout_row(&row, state, state->cursor, row_height, font);
            x = row.x0;

            for (i=0; i < row.num_chars && x < row.x1; ++i) {
                float dx = nk_textedit_get_width(state, start, i, font);
                x += dx;
                if (x > goal_x)
                    break;
                ++state->cursor;
            }
            nk_textedit_clamp(state);

            state->has_preferred_x = 1;
            state->preferred_x = goal_x;
            if (sel)
                state->select_end = state->cursor;
        }
    } break;

    case NK_KEY_UP: {
        struct nk_text_find find;
        struct nk_text_edit_row row;
        int i, sel = shift_mod;

        if (state->single_line) {
            /* on windows, up&down become left&right */
            key = NK_KEY_LEFT;
            goto retry;
        }

        if (sel)
            nk_textedit_prep_selection_at_cursor(state);
        else if (NK_TEXT_HAS_SELECTION(state))
            nk_textedit_move_to_first(state);

         /* compute current position of cursor point */
         nk_textedit_clamp(state);
         nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
                font, row_height);

         /* can only go up if there's a previous row */
         if (find.prev_first != find.first_char) {
            /* now find character position up a row */
            float x;
            float goal_x = state->has_preferred_x ? state->preferred_x : find.x;

            state->cursor = find.prev_first;
            nk_textedit_layout_row(&row, state, state->cursor, row_height, font);
            x = row.x0;

            for (i=0; i < row.num_chars && x < row.x1; ++i) {
                float dx = nk_textedit_get_width(state, find.prev_first, i, font);
                x += dx;
                if (x > goal_x)
                    break;
                ++state->cursor;
            }
            nk_textedit_clamp(state);

            state->has_preferred_x = 1;
            state->preferred_x = goal_x;
            if (sel) state->select_end = state->cursor;
         }
      } break;

    case NK_KEY_DEL:
        if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
            break;
        if (NK_TEXT_HAS_SELECTION(state))
            nk_textedit_delete_selection(state);
        else {
            int n = state->string.len;
            if (state->cursor < n)
                nk_textedit_delete(state, state->cursor, 1);
         }
         state->has_preferred_x = 0;
         break;

    case NK_KEY_BACKSPACE:
        if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
            break;
        if (NK_TEXT_HAS_SELECTION(state))
            nk_textedit_delete_selection(state);
        else {
            nk_textedit_clamp(state);
            if (state->cursor > 0) {
                nk_textedit_delete(state, state->cursor-1, 1);
                --state->cursor;
            }
         }
         state->has_preferred_x = 0;
         break;

    case NK_KEY_TEXT_START:
         if (shift_mod) {
            nk_textedit_prep_selection_at_cursor(state);
            state->cursor = state->select_end = 0;
            state->has_preferred_x = 0;
         } else {
            state->cursor = state->select_start = state->select_end = 0;
            state->has_preferred_x = 0;
         }
         break;

    case NK_KEY_TEXT_END:
         if (shift_mod) {
            nk_textedit_prep_selection_at_cursor(state);
            state->cursor = state->select_end = state->string.len;
            state->has_preferred_x = 0;
         } else {
            state->cursor = state->string.len;
            state->select_start = state->select_end = 0;
            state->has_preferred_x = 0;
         }
         break;

    case NK_KEY_TEXT_LINE_START: {
        if (shift_mod) {
            struct nk_text_find find;
           nk_textedit_clamp(state);
            nk_textedit_prep_selection_at_cursor(state);
            if (state->string.len && state->cursor == state->string.len)
                --state->cursor;
            nk_textedit_find_charpos(&find, state,state->cursor, state->single_line,
                font, row_height);
            state->cursor = state->select_end = find.first_char;
            state->has_preferred_x = 0;
        } else {
            struct nk_text_find find;
            if (state->string.len && state->cursor == state->string.len)
                --state->cursor;
            nk_textedit_clamp(state);
            nk_textedit_move_to_first(state);
            nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
                font, row_height);
            state->cursor = find.first_char;
            state->has_preferred_x = 0;
        }
      } break;

    case NK_KEY_TEXT_LINE_END: {
        if (shift_mod) {
            struct nk_text_find find;
            nk_textedit_clamp(state);
            nk_textedit_prep_selection_at_cursor(state);
            nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
                font, row_height);
            state->has_preferred_x = 0;
            state->cursor = find.first_char + find.length;
            if (find.length > 0 && nk_str_rune_at(&state->string, state->cursor-1) == '\n')
                --state->cursor;
            state->select_end = state->cursor;
        } else {
            struct nk_text_find find;
            nk_textedit_clamp(state);
            nk_textedit_move_to_first(state);
            nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
                font, row_height);

            state->has_preferred_x = 0;
            state->cursor = find.first_char + find.length;
            if (find.length > 0 && nk_str_rune_at(&state->string, state->cursor-1) == '\n')
                --state->cursor;
        }} break;
    }
}